

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::ListAggregateFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  UnifiedVectorFormat *count_p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  char cVar5;
  reference pvVar6;
  BoundFunctionExpression *pBVar7;
  pointer pFVar8;
  pointer pEVar9;
  BoundAggregateExpression *pBVar10;
  UnifiedVectorFormat *pUVar11;
  Vector *pVVar12;
  ulong uVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  void *pvVar15;
  idx_t idx_in_entry;
  idx_t child_idx;
  ulong uVar16;
  UnifiedVectorFormat *pUVar17;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  Vector slice;
  UnifiedVectorFormat lists_data;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  StateVector state_vector;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2a8;
  Vector *local_2a0;
  void *local_298;
  Vector *local_290;
  DataChunk *local_288;
  Vector *local_280;
  long local_278;
  long local_270;
  long local_268;
  BoundAggregateExpression *local_260;
  SelectionVector local_258;
  undefined8 local_240;
  long local_238;
  undefined1 local_230;
  unsigned_long local_228;
  LogicalType local_220 [24];
  undefined8 local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_200 [6];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  Vector local_158 [8];
  LogicalType local_150 [24];
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  long *local_f0 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  StateVector local_a8;
  
  count_p = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::SetVectorType((VectorType)result);
  FlatVector::VerifyFlatVector(result);
  if (pvVar6[8] != (value_type)0x1) {
    local_288 = args;
    pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
    pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                         *)(pBVar7 + 0x198));
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar8 + 0x20));
    pBVar10 = BaseExpression::Cast<duckdb::BoundAggregateExpression>((BaseExpression *)pEVar9);
    local_a8.count = *(idx_t *)(state + 0xb0);
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
              ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_a8);
    lVar19 = local_a8.count + 8;
    duckdb::ArenaAllocator::Reset();
    local_240 = *(undefined8 *)(pBVar10 + 0x1a0);
    local_230 = 1;
    local_238 = lVar19;
    pUVar11 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar6);
    pVVar12 = (Vector *)duckdb::ListVector::GetEntry(pvVar6);
    duckdb::Vector::Flatten((ulong)pVVar12);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f0);
    local_290 = pVVar12;
    duckdb::Vector::ToUnifiedFormat((ulong)pVVar12,pUVar11);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_1a0);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,count_p);
    local_278 = local_198;
    local_260 = pBVar10 + 0x58;
    lVar19 = (**(code **)(pBVar10 + 0x108))();
    local_298 = operator_new__(lVar19 * (long)count_p);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(pFVar8 + 0x20));
    (**(code **)(*(long *)pEVar9 + 0x88))(&local_2a8,pEVar9);
    StateVector::StateVector
              (&local_a8,(idx_t)count_p,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_2a8);
    if (local_2a8._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_2a8._M_head_impl + 8))();
    }
    local_2a8._M_head_impl = (Expression *)0x0;
    local_268 = local_a8._48_8_;
    duckdb::LogicalType::LogicalType(local_220,POINTER);
    duckdb::Vector::Vector(local_158,local_220,0x800);
    duckdb::LogicalType::~LogicalType(local_220);
    SelectionVector::SelectionVector(&local_258,0x800);
    local_2a0 = result;
    if (count_p == (UnifiedVectorFormat *)0x0) {
      uVar20 = 0;
    }
    else {
      local_280 = result + 0x30;
      uVar20 = 0;
      pUVar11 = (UnifiedVectorFormat *)0x0;
      local_270 = lVar19;
      do {
        pvVar15 = (void *)((long)pUVar11 * local_270 + (long)local_298);
        *(void **)(local_268 + (long)pUVar11 * 8) = pvVar15;
        (**(code **)(pBVar10 + 0x110))(local_260,pvVar15);
        pVVar12 = local_2a0;
        pUVar17 = pUVar11;
        if (*local_1a0 != 0) {
          pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_1a0 + (long)pUVar11 * 4);
        }
        if ((local_190 == 0) ||
           ((*(ulong *)(local_190 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1) != 0)
           ) {
          plVar18 = (long *)((long)pUVar17 * 0x10 + local_278);
          if (plVar18[1] != 0) {
            uVar16 = 0;
            do {
              if (uVar20 == 0x800) {
                duckdb::Vector::Vector((Vector *)&local_208,local_290,&local_258,0x800);
                (**(code **)(pBVar10 + 0x118))((Vector *)&local_208,&local_240,1,local_158,0x800);
                if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
                }
                if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
                }
                if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
                }
                duckdb::LogicalType::~LogicalType((LogicalType *)ap_Stack_200);
                uVar20 = 0;
              }
              uVar13 = *plVar18 + uVar16;
              if (*local_f0[0] != 0) {
                uVar13 = (ulong)*(uint *)(*local_f0[0] + uVar13 * 4);
              }
              local_258.sel_vector[uVar20] = (sel_t)uVar13;
              *(void **)(local_138 + uVar20 * 8) = pvVar15;
              uVar20 = uVar20 + 1;
              uVar16 = uVar16 + 1;
            } while (uVar16 < (ulong)plVar18[1]);
          }
        }
        else {
          if (*(long *)(local_2a0 + 0x28) == 0) {
            local_228 = *(unsigned_long *)(local_2a0 + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_208,&local_228);
            p_Var4 = ap_Stack_200[0];
            uVar3 = local_208;
            local_208 = 0;
            ap_Stack_200[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar12 + 0x38);
            *(undefined8 *)(pVVar12 + 0x30) = uVar3;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar12 + 0x38) = p_Var4;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (ap_Stack_200[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_200[0]);
            }
            pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 local_280);
            *(unsigned_long **)(local_2a0 + 0x28) =
                 (pTVar14->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          bVar2 = (byte)pUVar11 & 0x3f;
          puVar1 = (ulong *)(*(long *)(local_2a0 + 0x28) + ((ulong)pUVar11 >> 6) * 8);
          *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
        pUVar11 = pUVar11 + 1;
      } while (pUVar11 != count_p);
    }
    pVVar12 = local_2a0;
    if (uVar20 != 0) {
      duckdb::Vector::Vector((Vector *)&local_208,local_290,&local_258,uVar20);
      (**(code **)(pBVar10 + 0x118))(&local_208,&local_240,1,local_158,uVar20);
      if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
      }
      if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
      }
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
      }
      duckdb::LogicalType::~LogicalType((LogicalType *)ap_Stack_200);
    }
    (**(code **)(pBVar10 + 0x128))(&local_a8.state_vector,&local_240,pVVar12,count_p,0);
    cVar5 = duckdb::DataChunk::AllConstant();
    if (cVar5 != '\0') {
      duckdb::Vector::SetVectorType((VectorType)pVVar12);
    }
    if (local_258.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
    }
    if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    }
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    duckdb::LogicalType::~LogicalType(local_150);
    StateVector::~StateVector(&local_a8);
    operator_delete__(local_298);
    if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
    }
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    return;
  }
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListAggregateFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 2);
	ListAggregatesFunction<AggregateFunctor, true>(args, state, result);
}